

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgrec(fitsfile *fptr,int nrec,char *card,int *status)

{
  int *in_RCX;
  fitsfile *in_RDX;
  int in_ESI;
  int *in_stack_00000058;
  char *in_stack_00000060;
  fitsfile *in_stack_00000068;
  int nrec_00;
  int local_4;
  
  if (*in_RCX < 1) {
    nrec_00 = (int)((ulong)in_RCX >> 0x20);
    if (in_ESI == 0) {
      ffmaky(in_RDX,nrec_00,(int *)0x1d2b15);
      if (in_RDX != (fitsfile *)0x0) {
        *(undefined1 *)&in_RDX->HDUposition = 0;
      }
    }
    else if (0 < in_ESI) {
      ffmaky(in_RDX,nrec_00,(int *)0x1d2b40);
      ffgnky(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgrec( fitsfile *fptr,     /* I - FITS file pointer          */
            int nrec,           /* I - number of keyword to read  */
            char *card,         /* O - keyword card               */
            int  *status)       /* IO - error status              */
/*
  Read (get) the nrec-th keyword, returning the entire keyword card up to
  80 characters long.  The first keyword in the header has nrec = 1, not 0.
  The returned card value is null terminated with any trailing blank 
  characters removed.  If nrec = 0, then this routine simply moves the
  current header pointer to the top of the header.
*/
{
    if (*status > 0)
        return(*status);

    if (nrec == 0)
    {
        ffmaky(fptr, 1, status);  /* simply move to beginning of header */
        if (card)
            card[0] = '\0';           /* and return null card */
    }
    else if (nrec > 0)
    {
        ffmaky(fptr, nrec, status);
        ffgnky(fptr, card, status);
    }

    return(*status);
}